

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O0

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::writeInFile(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *this,char *filename,bool clearLog,bool append)

{
  Matrix<double,__1,_1,_0,__1,_1> *pMVar1;
  byte bVar2;
  TimeSize TVar3;
  TimeIndex TVar4;
  long lVar5;
  Index IVar6;
  Scalar *pSVar7;
  ostream *poVar8;
  char *pcVar9;
  runtime_error *this_00;
  string local_400 [32];
  runtime_error local_3e0 [8];
  runtime_error e;
  stringstream local_3d0 [8];
  stringstream ss;
  ostream local_3c0 [376];
  int local_248;
  int local_244;
  int j;
  int i;
  Matrix<double,__1,_1,_0,__1,_1> *m;
  TimeIndex k;
  ostream local_220 [8];
  ofstream f;
  bool append_local;
  bool clearLog_local;
  char *filename_local;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_local;
  
  std::ofstream::ofstream(local_220);
  if (append) {
    std::ofstream::open((char *)local_220,(_Ios_Openmode)filename);
  }
  else {
    std::ofstream::open((char *)local_220,(_Ios_Openmode)filename);
  }
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    TVar3 = size(this);
    if (0 < TVar3) {
      for (m = (Matrix<double,__1,_1,_0,__1,_1> *)getFirstIndex(this); pMVar1 = m,
          TVar4 = getNextIndex(this), (long)pMVar1 < TVar4;
          m = (Matrix<double,__1,_1,_0,__1,_1> *)
              ((long)&(m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data + 1)) {
        std::ostream::operator<<(local_220,(long)m);
        _j = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
             operator[](this,(TimeIndex)m);
        for (local_244 = 0; lVar5 = (long)local_244,
            IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)_j),
            lVar5 < IVar6; local_244 = local_244 + 1) {
          for (local_248 = 0; lVar5 = (long)local_248,
              IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cols
                                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)_j),
              lVar5 < IVar6; local_248 = local_248 + 1) {
            poVar8 = std::operator<<(local_220," ");
            pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               (_j,(long)local_244,(long)local_248);
            std::ostream::operator<<(poVar8,*pSVar7);
          }
        }
        std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
      }
    }
    if (clearLog) {
      clear(this);
    }
    std::ofstream::~ofstream(local_220);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_3d0);
  poVar8 = std::operator<<(local_3c0,"Logger: File ");
  poVar8 = std::operator<<(poVar8,filename);
  std::operator<<(poVar8," could not be created/opened.");
  std::__cxx11::stringstream::str();
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::runtime_error::runtime_error(local_3e0,pcVar9);
  std::__cxx11::string::~string(local_400);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_3e0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::writeInFile(const char * filename, bool clearLog, bool append)
{
  std::ofstream f;
  if (!append)
  {
    f.open(filename);
  }
  else
  {
    f.open(filename,std::ofstream::app);
  }

  if (f.is_open())
  {
    if (size()>0)
    {

      for (TimeIndex k=getFirstIndex(); k<getNextIndex(); ++k)
      {

        f << k;

        MatrixType & m = operator[](k);

        for (int i = 0 ; i< m.rows(); ++i)
        {
          for (int j = 0 ; j< m.cols(); ++j)
          {
            f << " "<< m(i,j);
          }
        }
        f << std::endl;
      }
    }

    if (clearLog)
    {
      clear();
    }
  }
  else
  {
    std::stringstream ss;
    ss<< "Logger: File " <<filename<<" could not be created/opened.";
    std::runtime_error e(ss.str().c_str());
    throw e;
  }

}